

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

int __thiscall
CVmObjStringBuffer::getp_copyChars
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  int iVar2;
  vm_strbuf_ext *pvVar3;
  char *pcVar4;
  vm_val_t *pvVar5;
  size_t sVar6;
  CVmObjStringBuffer *this_00;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjStringBuffer *in_RDI;
  size_t src_chars;
  utf8_ptr srcp;
  size_t src_bytes;
  char *src;
  vm_val_t srcval;
  int32_t idx;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  utf8_ptr *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int32_t iVar7;
  int32_t ins_bytes;
  int32_t in_stack_ffffffffffffffa4;
  undefined8 local_48;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffcc;
  
  if ((getp_copyChars(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_copyChars(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_copyChars::desc,2);
    __cxa_guard_release(&getp_copyChars(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (uint *)in_stack_ffffffffffffff80,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (iVar2 == 0) {
    iVar2 = CVmBif::pop_int_val();
    if (iVar2 < 0) {
      pvVar3 = get_ext(in_RDI);
      iVar7 = pvVar3->len;
    }
    else {
      iVar7 = -1;
    }
    ins_bytes = (int32_t)((ulong)in_RDI >> 0x20);
    iVar2 = iVar7 + iVar2;
    CVmStack::get(0);
    pcVar4 = vm_val_t::cast_to_string
                       ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffcc,iVar2),
                        (vm_val_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    pvVar5 = CVmStack::get(0);
    *(undefined8 *)pvVar5 = local_48;
    aVar1._4_4_ = in_stack_ffffffffffffffc4;
    aVar1.intval = in_stack_ffffffffffffffc0;
    pvVar5->val = aVar1;
    sVar6 = vmb_get_len((char *)0x33598f);
    this_00 = (CVmObjStringBuffer *)(pcVar4 + 2);
    utf8_ptr::utf8_ptr(in_stack_ffffffffffffff80,
                       (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    pcVar4 = (char *)utf8_ptr::len(in_stack_ffffffffffffff80,
                                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    splice_text(this_00,(vm_obj_id_t)(sVar6 >> 0x20),(int32_t)sVar6,in_stack_ffffffffffffffa4,pcVar4
                ,ins_bytes,in_stack_ffffffffffffffc0);
    CVmStack::discard();
    vm_val_t::set_obj(in_RDX,in_ESI);
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_copyChars(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the insertion index; adjust to 0-based or end-based indexing */
    int32_t idx = CVmBif::pop_int_val(vmg0_);
    idx += (idx < 0 ? get_ext()->len : -1);

    /* get or cast the string; leave it on the stack for gc protection */
    vm_val_t srcval;
    const char *src = G_stk->get(0)->cast_to_string(vmg_ &srcval);
    *G_stk->get(0) = srcval;

    /* 
     *   Get the character length of the new text.  This is the number of
     *   characters we're overwriting (effectively deleting) in the current
     *   buffer.  
     */
    size_t src_bytes = vmb_get_len(src);
    src += VMB_LEN;
    
    /* get the new text's character length */
    utf8_ptr srcp((char *)src);
    size_t src_chars = srcp.len(src_bytes);

    /* splice the text */
    splice_text(vmg_ self, idx, src_chars, src, src_bytes, TRUE);

    /* discard gc protection */
    G_stk->discard();

    /* handled */
    retval->set_obj(self);
    return TRUE;
}